

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Bac_ManWriteVar(Bac_Ntk_t *p,int RealName)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Vec_Str_t *pVVar4;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  size_t __size;
  
  pVVar4 = p->pDesign->vOut;
  __s = Abc_NamStr(p->pDesign->pStrs,RealName);
  sVar5 = strlen(__s);
  if (0 < (int)(uint)sVar5) {
    uVar7 = 0;
    do {
      cVar1 = __s[uVar7];
      uVar2 = pVVar4->nCap;
      if (pVVar4->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
          }
          __size = 0x10;
        }
        else {
          __size = (ulong)uVar2 * 2;
          if ((int)__size <= (int)uVar2) goto LAB_003a22b9;
          if (pVVar4->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(__size);
          }
          else {
            pcVar6 = (char *)realloc(pVVar4->pArray,__size);
          }
        }
        pVVar4->pArray = pcVar6;
        pVVar4->nCap = (int)__size;
      }
LAB_003a22b9:
      iVar3 = pVVar4->nSize;
      pVVar4->nSize = iVar3 + 1;
      pVVar4->pArray[iVar3] = cVar1;
      uVar7 = uVar7 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar7);
  }
  return;
}

Assistant:

static inline void Bac_ManWriteVar( Bac_Ntk_t * p, int RealName )
{
    Vec_StrPrintStr( p->pDesign->vOut, Bac_NtkStr(p, RealName) );
}